

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O3

void CtermCheck(chainEndData_t *ed,int rescnt,int isChainEnd)

{
  byte *pbVar1;
  int iVar2;
  atom *paVar3;
  long lVar4;
  
  if (rescnt == 0 || isChainEnd == 0) {
    return;
  }
  lVar4 = 0;
  do {
    paVar3 = ed->ambigN[lVar4];
    if (paVar3 == (atom *)0x0) break;
    iVar2 = paVar3->r->rescnt;
    if ((iVar2 == ed->first) && (ed->Ntmarkers == iVar2)) {
      pbVar1 = (byte *)((long)&paVar3->props + 2);
      *pbVar1 = *pbVar1 | 0x40;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 8;
  do {
    paVar3 = ed->ambigN[lVar4];
    if (paVar3 == (atom *)0x0) break;
    if ((paVar3->r->rescnt == rescnt) && (ed->Ctmarkers == rescnt)) {
      pbVar1 = (byte *)((long)&paVar3->props + 2);
      *pbVar1 = *pbVar1 | 0x20;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  memset(ed,0,0xa4);
  return;
}

Assistant:

void CtermCheck(chainEndData_t *ed, int rescnt, int isChainEnd)
{
   int i = 0;
   /* avoid processing the first time 'cause there ain't no chain pending */

   if (isChainEnd && rescnt) {
      ed->last = rescnt; /* last residue */

      /* see if we can put the pieces together to determine end charge */

      for (i = 0; i < 4; i++) { /* only array[0-3] contains first Ns */
	 if (ed->ambigN[i]) {
	    if (ed->ambigN[i]->r->rescnt == ed->first
	    &&  ed->Ntmarkers         == ed->first) {
	       ed->ambigN[i]->props |= POSITIVE_PROP;
	    }
	 }
	 else { break; }
      }
      for (i = 0; i < 8; i++) { /* array[0-7] contains last Os */
	 if (ed->ambigO[i]) {
	    if (ed->ambigO[i]->r->rescnt == ed->last
	    &&  ed->Ctmarkers         == ed->last) {
	       ed->ambigO[i]->props |= NEGATIVE_PROP;
	    }
	 }
	 else { break; }
      }

      initEndData(ed); /* reset the end data record */
   }
}